

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_soft.c
# Opt level: O2

void shader_texture_solid_any_step(uintptr_t state,int minor)

{
  double *pdVar1;
  double dVar2;
  
  pdVar1 = (double *)(state + 0x40 + (ulong)(minor == 0) * 0x10);
  dVar2 = pdVar1[1];
  *(double *)(state + 0x30) = *pdVar1 + *(double *)(state + 0x30);
  *(double *)(state + 0x38) = dVar2 + *(double *)(state + 0x38);
  return;
}

Assistant:

static void shader_texture_solid_any_step(uintptr_t state, int minor)
{
   state_texture_solid_any_2d* s = (state_texture_solid_any_2d*)state;
   if (minor) {
      s->u += s->minor_du;
      s->v += s->minor_dv;
   } else {
      s->u += s->major_du;
      s->v += s->major_dv;
   }
}